

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwDefaultWindowHints(void)

{
  if (_glfw.initialized != 0) {
    _glfw.hints.context.nsgl.offline = 0;
    _glfw.hints.context._52_4_ = 0;
    _glfw.hints.context.robustness = 0;
    _glfw.hints.context.release = 0;
    _glfw.hints.context.share = (_GLFWwindow *)0x0;
    _glfw.hints.context.forward = 0;
    _glfw.hints.context.debug = 0;
    _glfw.hints.context.noerror = 0;
    _glfw.hints.context.profile = 0;
    _glfw.hints.context.client = 0x30001;
    _glfw.hints.context.source = 0x36001;
    _glfw.hints.context.major = 1;
    _glfw.hints.context.minor = 0;
    memset(&_glfw.hints.window.width,0,0x448);
    _glfw.hints.window.resizable = 1;
    _glfw.hints.window.visible = 1;
    _glfw.hints.window.decorated = 1;
    _glfw.hints.window.focused = 1;
    _glfw.hints.window.autoIconify = 1;
    _glfw.hints.window.centerCursor = 1;
    _glfw.hints.window.focusOnShow = 1;
    _glfw.hints.window.xpos = -0x80000000;
    _glfw.hints.window.ypos = -0x80000000;
    _glfw.hints.window.scaleFramebuffer = 1;
    _glfw.hints.framebuffer.handle = 0;
    _glfw.hints.framebuffer.accumRedBits = 0;
    _glfw.hints.framebuffer.accumGreenBits = 0;
    _glfw.hints.framebuffer.accumBlueBits = 0;
    _glfw.hints.framebuffer.accumAlphaBits = 0;
    _glfw.hints.framebuffer.auxBuffers = 0;
    _glfw.hints.framebuffer.stereo = 0;
    _glfw.hints.framebuffer.samples = 0;
    _glfw.hints.framebuffer.sRGB = 0;
    _glfw.hints.framebuffer.redBits = 8;
    _glfw.hints.framebuffer.greenBits = 8;
    _glfw.hints.framebuffer.blueBits = 8;
    _glfw.hints.framebuffer.alphaBits = 8;
    _glfw.hints.framebuffer.depthBits = 0x18;
    _glfw.hints.framebuffer.stencilBits = 8;
    _glfw.hints.framebuffer.doublebuffer = 1;
    _glfw.hints.framebuffer.transparent = 0;
    _glfw.hints.refreshRate = -1;
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

void glfwDefaultWindowHints(void)
{
    _GLFW_REQUIRE_INIT();

    // The default is OpenGL with minimum version 1.0
    memset(&_glfw.hints.context, 0, sizeof(_glfw.hints.context));
    _glfw.hints.context.client = GLFW_OPENGL_API;
    _glfw.hints.context.source = GLFW_NATIVE_CONTEXT_API;
    _glfw.hints.context.major  = 1;
    _glfw.hints.context.minor  = 0;

    // The default is a focused, visible, resizable window with decorations
    memset(&_glfw.hints.window, 0, sizeof(_glfw.hints.window));
    _glfw.hints.window.resizable    = GLFW_TRUE;
    _glfw.hints.window.visible      = GLFW_TRUE;
    _glfw.hints.window.decorated    = GLFW_TRUE;
    _glfw.hints.window.focused      = GLFW_TRUE;
    _glfw.hints.window.autoIconify  = GLFW_TRUE;
    _glfw.hints.window.centerCursor = GLFW_TRUE;
    _glfw.hints.window.focusOnShow  = GLFW_TRUE;
    _glfw.hints.window.xpos         = GLFW_ANY_POSITION;
    _glfw.hints.window.ypos         = GLFW_ANY_POSITION;
    _glfw.hints.window.scaleFramebuffer = GLFW_TRUE;

    // The default is 24 bits of color, 24 bits of depth and 8 bits of stencil,
    // double buffered
    memset(&_glfw.hints.framebuffer, 0, sizeof(_glfw.hints.framebuffer));
    _glfw.hints.framebuffer.redBits      = 8;
    _glfw.hints.framebuffer.greenBits    = 8;
    _glfw.hints.framebuffer.blueBits     = 8;
    _glfw.hints.framebuffer.alphaBits    = 8;
    _glfw.hints.framebuffer.depthBits    = 24;
    _glfw.hints.framebuffer.stencilBits  = 8;
    _glfw.hints.framebuffer.doublebuffer = GLFW_TRUE;

    // The default is to select the highest available refresh rate
    _glfw.hints.refreshRate = GLFW_DONT_CARE;
}